

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateGeneralWeightParams
                   (Result *__return_storage_ptr__,WeightParams *weight,uint64_t expectedUnits,
                   uint64_t outChannels,string *layerClassName,string *layerName,string *weightName)

{
  bool bVar1;
  WeightParamType WVar2;
  unsigned_long __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Result r;
  
  Result::Result(&r);
  WVar2 = valueType(weight);
  if (WVar2 < QUINT) {
    if (WVar2 == FLOAT32) {
      __val = (unsigned_long)(weight->floatvalue_).current_size_;
    }
    else {
      __val = ((weight->float16value_).ptr_)->_M_string_length >> 1;
    }
    if (__val == expectedUnits) {
LAB_005a2790:
      Result::Result(__return_storage_ptr__,&r);
      goto LAB_005a2b95;
    }
    std::operator+(&local_78,layerClassName,"Layer \'");
    std::operator+(&local_118,&local_78,layerName);
    std::operator+(&local_f8,&local_118,"\' has incorrect ");
    std::operator+(&local_d8,&local_f8,weightName);
    std::operator+(&bStack_1b8,&local_d8," size ");
    std::__cxx11::to_string(&local_98,__val);
    std::operator+(&local_198,&bStack_1b8,&local_98);
    std::operator+(&local_178,&local_198," (expected ");
    std::__cxx11::to_string(&local_b8,expectedUnits);
    std::operator+(&local_158,&local_178,&local_b8);
    std::operator+(&err,&local_158,").");
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&bStack_1b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_78);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else if (WVar2 == UNSPECIFIED) {
    std::operator+(&bStack_1b8,layerClassName,"Layer \'");
    std::operator+(&local_198,&bStack_1b8,layerName);
    std::operator+(&local_178,&local_198,"\' has unspecified ");
    std::operator+(&local_158,&local_178,weightName);
    std::operator+(&err,&local_158,".");
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&bStack_1b8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else if (WVar2 == QUINT) {
    bVar1 = hasSufficientBytesInQuantizedWeightParam(weight,expectedUnits);
    if (bVar1) {
      bVar1 = hasValidQuantizationParams(weight,(int)outChannels);
      if (bVar1) goto LAB_005a2790;
      std::operator+(&bStack_1b8,layerClassName,"Layer \'");
      std::operator+(&local_198,&bStack_1b8,layerName);
      std::operator+(&local_178,&local_198,"\' has invalid quantization parameters for quantized ");
      std::operator+(&local_158,&local_178,weightName);
      std::operator+(&err,&local_158,".");
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&bStack_1b8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
      std::operator+(&local_f8,layerClassName,"Layer \'");
      std::operator+(&local_d8,&local_f8,layerName);
      std::operator+(&bStack_1b8,&local_d8,"\' has insufficient bytes for quantized ");
      std::operator+(&local_198,&bStack_1b8,weightName);
      std::operator+(&local_178,&local_198," with ");
      std::__cxx11::to_string(&local_118,expectedUnits);
      std::operator+(&local_158,&local_178,&local_118);
      std::operator+(&err,&local_158,"units.");
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&bStack_1b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
  }
  else {
    std::operator+(&bStack_1b8,layerClassName,"Layer \'");
    std::operator+(&local_198,&bStack_1b8,layerName);
    std::operator+(&local_178,&local_198,"\' has empty ");
    std::operator+(&local_158,&local_178,weightName);
    std::operator+(&err,&local_158,".");
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&bStack_1b8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  std::__cxx11::string::~string((string *)&err);
LAB_005a2b95:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateGeneralWeightParams(const CoreML::Specification::WeightParams& weight,
                                          const uint64_t expectedUnits,
                                          const uint64_t outChannels,
                                          const std::string& layerClassName,
                                          const std::string& layerName,
                                          const std::string& weightName){
    // Validate a 2D WeightParam
    Result r;
    WeightParamType wType = valueType(weight);
    uint64_t size = 0;
    if (wType == FLOAT32 || wType == FLOAT16){
        if (wType == FLOAT32){
            size = static_cast<uint64_t>(weight.floatvalue().size());
        } else {
            size = static_cast<uint64_t>(weight.float16value().size()/2);
        }
        if (size != expectedUnits){
            const std::string err = layerClassName + "Layer '" + layerName + "' has incorrect " +
            weightName + " size " + std::to_string(size) + " (expected " +
            std::to_string(expectedUnits) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == QUINT){
        if (!CoreML::hasSufficientBytesInQuantizedWeightParam(weight, expectedUnits)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has insufficient bytes for quantized " + weightName + " with " +
            std::to_string(expectedUnits) + "units.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!CoreML::hasValidQuantizationParams(weight, (int) outChannels)){
            const std::string err = layerClassName + "Layer '" + layerName +
            "' has invalid quantization parameters for quantized " + weightName + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else if (wType == UNSPECIFIED){
        const std::string err = layerClassName + "Layer '" + layerName + "' has unspecified " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    } else { // EMPTY
        const std::string err = layerClassName + "Layer '" + layerName + "' has empty " + weightName + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return r;
}